

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigDup.c
# Opt level: O2

void Saig_ManDupCones_rec
               (Aig_Man_t *p,Aig_Obj_t *pObj,Vec_Ptr_t *vLeaves,Vec_Ptr_t *vNodes,Vec_Ptr_t *vRoots)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  int iVar2;
  uint uVar3;
  
  iVar1 = p->nTravIds;
  while( true ) {
    if (pObj->TravId == iVar1) {
      return;
    }
    pObj->TravId = iVar1;
    uVar3 = (uint)*(undefined8 *)&pObj->field_0x18;
    if (0xfffffffd < (uVar3 & 7) - 7) break;
    if ((uVar3 & 7) != 3) {
      iVar1 = Saig_ObjIsLo(p,pObj);
      if (iVar1 == 0) {
        if (((*(uint *)&pObj->field_0x18 & 7) != 2) ||
           (iVar1 = Aig_ObjCioId(pObj), vRoots = vLeaves, p->nTruePis <= iVar1)) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigDup.c"
                        ,0x21f,
                        "void Saig_ManDupCones_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                       );
        }
      }
      else {
        iVar1 = Saig_ObjIsLo(p,pObj);
        if (iVar1 == 0) {
          __assert_fail("Saig_ObjIsLo(p, pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saig.h"
                        ,0x56,"Aig_Obj_t *Saig_ObjLoToLi(Aig_Man_t *, Aig_Obj_t *)");
        }
        p_00 = p->vCos;
        iVar1 = p->nTruePos;
        iVar2 = Aig_ObjCioId(pObj);
        pObj = (Aig_Obj_t *)Vec_PtrEntry(p_00,(iVar1 + iVar2) - p->nTruePis);
      }
      goto LAB_0058d667;
    }
    pObj = (Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
  }
  Saig_ManDupCones_rec
            (p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vLeaves,vNodes,vRoots);
  Saig_ManDupCones_rec
            (p,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),vLeaves,vNodes,vRoots);
  vRoots = vNodes;
LAB_0058d667:
  Vec_PtrPush(vRoots,pObj);
  return;
}

Assistant:

void Saig_ManDupCones_rec( Aig_Man_t * p, Aig_Obj_t * pObj, Vec_Ptr_t * vLeaves, Vec_Ptr_t * vNodes, Vec_Ptr_t * vRoots )
{
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(p, pObj);
    if ( Aig_ObjIsNode(pObj) )
    {
        Saig_ManDupCones_rec( p, Aig_ObjFanin0(pObj), vLeaves, vNodes, vRoots );
        Saig_ManDupCones_rec( p, Aig_ObjFanin1(pObj), vLeaves, vNodes, vRoots );
        Vec_PtrPush( vNodes, pObj );
    }
    else if ( Aig_ObjIsCo(pObj) )
        Saig_ManDupCones_rec( p, Aig_ObjFanin0(pObj), vLeaves, vNodes, vRoots );
    else if ( Saig_ObjIsLo(p, pObj) )
        Vec_PtrPush( vRoots, Saig_ObjLoToLi(p, pObj) );
    else if ( Saig_ObjIsPi(p, pObj) )
        Vec_PtrPush( vLeaves, pObj );
    else assert( 0 );
}